

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
::QueryPoolGraphicStatisticsTest
          (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
           *this,TestContext *context,char *name,char *description,
          ParametersGraphic parametersGraphic)

{
  char *__s;
  Vec4 local_4c8;
  Vector<float,_4> local_4b8;
  VertexData local_4a8;
  deUint32 local_488;
  Vec4 local_484;
  Vector<float,_4> local_474;
  VertexData local_464;
  deUint32 local_444;
  Vec4 local_440;
  Vector<float,_4> local_430;
  VertexData local_420;
  deUint32 local_400;
  Vec4 local_3fc;
  Vector<float,_4> local_3ec;
  VertexData local_3dc;
  deUint32 local_3bc;
  Vec4 local_3b8;
  Vector<float,_4> local_3a8;
  VertexData local_398;
  deUint32 local_378;
  Vec4 local_374;
  Vector<float,_4> local_364;
  VertexData local_354;
  deUint32 local_334;
  Vec4 local_330;
  Vector<float,_4> local_320;
  VertexData local_310;
  deUint32 local_2f0;
  Vec4 local_2ec;
  Vector<float,_4> local_2dc;
  VertexData local_2cc;
  deUint32 local_2ac;
  Vec4 local_2a8;
  Vector<float,_4> local_298;
  VertexData local_288;
  deUint32 local_268;
  Vec4 local_264;
  Vector<float,_4> local_254;
  VertexData local_244;
  deUint32 local_224;
  Vec4 local_220;
  Vector<float,_4> local_210;
  VertexData local_200;
  deUint32 local_1e0;
  Vec4 local_1dc;
  Vector<float,_4> local_1cc;
  VertexData local_1bc;
  deUint32 local_19c;
  Vec4 local_198;
  Vector<float,_4> local_188;
  VertexData local_178;
  deUint32 local_158;
  Vec4 local_154;
  Vector<float,_4> local_144;
  VertexData local_134;
  deUint32 local_114;
  Vec4 local_110;
  Vector<float,_4> local_100;
  VertexData local_f0;
  deUint32 local_d0;
  Vec4 local_cc;
  Vector<float,_4> local_bc;
  VertexData local_ac;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *description_local;
  char *name_local;
  TestContext *context_local;
  QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
  *this_local;
  ParametersGraphic parametersGraphic_local;
  
  local_30 = description;
  description_local = name;
  name_local = (char *)context;
  context_local = (TestContext *)this;
  this_local = (QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::TessellationShaderSecondrayInheritedTestInstance>
                *)parametersGraphic;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  __s = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  TestCase::TestCase(&this->super_TestCase,context,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__QueryPoolGraphicStatisticsTest_016ad7c8;
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::vector(&this->m_data);
  this->m_parametersGraphic = (ParametersGraphic)this_local;
  tcu::Vector<float,_4>::Vector(&local_bc,-1.0,-1.0,1.0,1.0);
  local_d0 = (deUint32)tcu::RGBA::red();
  tcu::RGBA::toVec((RGBA *)&local_cc);
  GraphicBasicTestInstance::VertexData::VertexData(&local_ac,&local_bc,&local_cc);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_ac);
  tcu::Vector<float,_4>::Vector(&local_100,-1.0,0.0,1.0,1.0);
  local_114 = (deUint32)tcu::RGBA::red();
  tcu::RGBA::toVec((RGBA *)&local_110);
  GraphicBasicTestInstance::VertexData::VertexData(&local_f0,&local_100,&local_110);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_f0);
  tcu::Vector<float,_4>::Vector(&local_144,0.0,-1.0,1.0,1.0);
  local_158 = (deUint32)tcu::RGBA::red();
  tcu::RGBA::toVec((RGBA *)&local_154);
  GraphicBasicTestInstance::VertexData::VertexData(&local_134,&local_144,&local_154);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_134);
  tcu::Vector<float,_4>::Vector(&local_188,0.0,0.0,1.0,1.0);
  local_19c = (deUint32)tcu::RGBA::red();
  tcu::RGBA::toVec((RGBA *)&local_198);
  GraphicBasicTestInstance::VertexData::VertexData(&local_178,&local_188,&local_198);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_178);
  tcu::Vector<float,_4>::Vector(&local_1cc,-1.0,0.0,1.0,1.0);
  local_1e0 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_1dc);
  GraphicBasicTestInstance::VertexData::VertexData(&local_1bc,&local_1cc,&local_1dc);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_1bc);
  tcu::Vector<float,_4>::Vector(&local_210,-1.0,1.0,1.0,1.0);
  local_224 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_220);
  GraphicBasicTestInstance::VertexData::VertexData(&local_200,&local_210,&local_220);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_200);
  tcu::Vector<float,_4>::Vector(&local_254,0.0,0.0,1.0,1.0);
  local_268 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_264);
  GraphicBasicTestInstance::VertexData::VertexData(&local_244,&local_254,&local_264);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_244);
  tcu::Vector<float,_4>::Vector(&local_298,0.0,1.0,1.0,1.0);
  local_2ac = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&local_2a8);
  GraphicBasicTestInstance::VertexData::VertexData(&local_288,&local_298,&local_2a8);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_288);
  tcu::Vector<float,_4>::Vector(&local_2dc,0.0,-1.0,1.0,1.0);
  local_2f0 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_2ec);
  GraphicBasicTestInstance::VertexData::VertexData(&local_2cc,&local_2dc,&local_2ec);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_2cc);
  tcu::Vector<float,_4>::Vector(&local_320,0.0,0.0,1.0,1.0);
  local_334 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_330);
  GraphicBasicTestInstance::VertexData::VertexData(&local_310,&local_320,&local_330);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_310);
  tcu::Vector<float,_4>::Vector(&local_364,1.0,-1.0,1.0,1.0);
  local_378 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_374);
  GraphicBasicTestInstance::VertexData::VertexData(&local_354,&local_364,&local_374);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_354);
  tcu::Vector<float,_4>::Vector(&local_3a8,1.0,0.0,1.0,1.0);
  local_3bc = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_3b8);
  GraphicBasicTestInstance::VertexData::VertexData(&local_398,&local_3a8,&local_3b8);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_398);
  tcu::Vector<float,_4>::Vector(&local_3ec,0.0,0.0,1.0,1.0);
  local_400 = (deUint32)tcu::RGBA::gray();
  tcu::RGBA::toVec((RGBA *)&local_3fc);
  GraphicBasicTestInstance::VertexData::VertexData(&local_3dc,&local_3ec,&local_3fc);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_3dc);
  tcu::Vector<float,_4>::Vector(&local_430,0.0,1.0,1.0,1.0);
  local_444 = (deUint32)tcu::RGBA::gray();
  tcu::RGBA::toVec((RGBA *)&local_440);
  GraphicBasicTestInstance::VertexData::VertexData(&local_420,&local_430,&local_440);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_420);
  tcu::Vector<float,_4>::Vector(&local_474,1.0,0.0,1.0,1.0);
  local_488 = (deUint32)tcu::RGBA::gray();
  tcu::RGBA::toVec((RGBA *)&local_484);
  GraphicBasicTestInstance::VertexData::VertexData(&local_464,&local_474,&local_484);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_464);
  tcu::Vector<float,_4>::Vector(&local_4b8,1.0,1.0,1.0,1.0);
  tcu::RGBA::gray();
  tcu::RGBA::toVec((RGBA *)&local_4c8);
  GraphicBasicTestInstance::VertexData::VertexData(&local_4a8,&local_4b8,&local_4c8);
  std::
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  ::push_back(&this->m_data,&local_4a8);
  return;
}

Assistant:

QueryPoolGraphicStatisticsTest (tcu::TestContext &context, const char *name, const char *description, const GraphicBasicTestInstance::ParametersGraphic parametersGraphic)
		: TestCase				(context, name, description)
		, m_parametersGraphic	(parametersGraphic)
	{
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::red().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f,-1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec()));

		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 0.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 0.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
		m_data.push_back(GraphicBasicTestInstance::VertexData(tcu::Vec4( 1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::gray().toVec()));
	}